

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_symbols(set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *v)

{
  set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *this;
  bool bVar1;
  ostream *this_00;
  string local_270;
  reference local_250;
  Symbol *it;
  iterator __end1;
  iterator __begin1;
  set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *__range1;
  char local_220 [8];
  fstream f;
  ostream local_210 [512];
  set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *local_10;
  set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *v_local;
  
  local_10 = v;
  std::fstream::fstream(local_220);
  std::fstream::open(local_220,0x12503a);
  this = local_10;
  __end1 = std::set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_>::begin(local_10);
  it = (Symbol *)std::set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_>::end(this);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar1) break;
    local_250 = std::_Rb_tree_const_iterator<Symbol>::operator*(&__end1);
    Symbol::to_string_abi_cxx11_(&local_270,local_250);
    this_00 = std::operator<<(local_210,(string *)&local_270);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_270);
    std::_Rb_tree_const_iterator<Symbol>::operator++(&__end1);
  }
  std::fstream::close();
  std::fstream::~fstream(local_220);
  return;
}

Assistant:

void print_symbols(const set<Symbol> &v) {
    fstream f;
    f.open("symbol.txt", ios::out);
    for (const auto &it : v) {
        f << it.to_string() << endl;
    }
    f.close();
}